

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

word Abc_TtDeriveBiDecOne(word *pTruth,int nVars,int This)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int w;
  uint uVar4;
  ulong uVar5;
  word *pwVar6;
  word wVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  word *pwVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  word *pwVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  word pTemp [64];
  word Cof1 [64];
  word Cof0 [64];
  
  uVar18 = (ulong)(uint)(1 << ((char)nVars - 6U & 0x1f));
  if (nVars < 7) {
    uVar18 = 1;
  }
  iVar9 = (int)uVar18;
  Abc_TtCopy(pTemp,pTruth,iVar9,0);
  uVar14 = 0;
  if (0 < iVar9) {
    uVar14 = uVar18;
  }
  uVar20 = 0;
  uVar17 = 0;
  if (0 < nVars) {
    uVar20 = nVars;
    uVar17 = 0;
  }
  for (; uVar17 != uVar20; uVar17 = uVar17 + 1) {
    if (((uint)This >> (uVar17 & 0x1f) & 1) == 0) {
      Abc_TtCofactor0p(Cof0,pTemp,iVar9,uVar17);
      Abc_TtCofactor1p(Cof1,pTemp,iVar9,uVar17);
      for (uVar5 = 0; uVar14 != uVar5; uVar5 = uVar5 + 1) {
        pTemp[uVar5] = Cof1[uVar5] | Cof0[uVar5];
      }
    }
  }
  uVar17 = Abc_TtBitCount16(This);
  if (0x10 < nVars) {
    __assert_fail("nVarsAll <= 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                  ,0x558,"void Abc_TtShrink(word *, int, int, unsigned int)");
  }
  uVar10 = 0;
  for (uVar14 = 0; uVar14 != uVar20; uVar14 = uVar14 + 1) {
    if (((uint)This >> ((uint)uVar14 & 0x1f) & 1) != 0) {
      uVar5 = uVar14;
      while ((long)(int)uVar10 < (long)uVar5) {
        uVar1 = uVar5 - 1;
        if ((long)uVar5 < 6) {
          uVar13 = s_PMasks[uVar1][0];
          uVar2 = s_PMasks[uVar1][1];
          uVar3 = s_PMasks[uVar1][2];
          for (uVar19 = 0; uVar5 = uVar1, uVar18 != uVar19; uVar19 = uVar19 + 1) {
            uVar5 = pTemp[uVar19];
            bVar8 = (byte)(1 << ((byte)uVar1 & 0x1f));
            pTemp[uVar19] =
                 (uVar5 & uVar3) >> (bVar8 & 0x3f) |
                 (uVar5 & uVar2) << (bVar8 & 0x3f) | uVar5 & uVar13;
          }
        }
        else if (uVar1 == 5) {
          for (pwVar6 = pTemp; uVar5 = uVar1, pwVar6 < pTemp + uVar18; pwVar6 = pwVar6 + 2) {
            *(ulong *)((long)pwVar6 + 4) =
                 CONCAT44((int)*(undefined8 *)((long)pwVar6 + 4),
                          (int)((ulong)*(undefined8 *)((long)pwVar6 + 4) >> 0x20));
          }
        }
        else {
          uVar11 = 1 << ((char)uVar5 - 7U & 0x1f);
          if (uVar5 < 8) {
            uVar11 = 1;
          }
          iVar9 = uVar11 * 4;
          uVar13 = 0;
          if (0 < (int)uVar11) {
            uVar13 = (ulong)uVar11;
          }
          pwVar12 = pTemp + (int)(uVar11 * 2);
          pwVar16 = pTemp + (int)uVar11;
          for (pwVar6 = pTemp; uVar5 = uVar1, pwVar6 < pTemp + uVar18; pwVar6 = pwVar6 + iVar9) {
            for (uVar5 = 0; uVar13 != uVar5; uVar5 = uVar5 + 1) {
              wVar7 = pwVar16[uVar5];
              pwVar16[uVar5] = pwVar12[uVar5];
              pwVar12[uVar5] = wVar7;
            }
            pwVar12 = pwVar12 + iVar9;
            pwVar16 = pwVar16 + iVar9;
          }
        }
      }
      uVar10 = uVar10 + 1;
    }
  }
  if (uVar10 != uVar17) {
    __assert_fail("Var == nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                  ,0x560,"void Abc_TtShrink(word *, int, int, unsigned int)");
  }
  if ((int)uVar17 < 0) {
    __assert_fail("nVars >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                  ,0x30d,"word Abc_Tt6Stretch(word, int)");
  }
  uVar20 = 2;
  if (2 < uVar17) {
    uVar20 = uVar17;
  }
  uVar10 = 3;
  if (2 < uVar17) {
    uVar10 = uVar20;
  }
  uVar20 = 4;
  if (uVar10 != 3) {
    uVar20 = uVar10;
  }
  uVar11 = 5;
  if (uVar20 != 4) {
    uVar11 = uVar20;
  }
  if (1 < uVar11 - 5) {
    __assert_fail("nVars == 6",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                  ,0x31a,"word Abc_Tt6Stretch(word, int)");
  }
  uVar4 = (uint)pTemp[0];
  uVar15 = -(uVar4 & 1);
  if (uVar17 != 0) {
    uVar15 = uVar4;
  }
  uVar15 = (uVar15 & 3) * 5;
  if (1 < uVar17) {
    uVar15 = uVar4;
  }
  uVar18 = (ulong)(uVar15 & 0xf) * 0x11;
  if (2 < uVar17) {
    uVar18 = pTemp[0];
  }
  uVar14 = (uVar18 & 0xff) * 0x101;
  if (uVar10 != 3) {
    uVar14 = uVar18;
  }
  uVar18 = (uVar14 & 0xffff) * 0x10001;
  if (uVar20 != 4) {
    uVar18 = uVar14;
  }
  wVar7 = (uVar18 & 0xffffffff) * 0x100000001;
  if (uVar11 != 5) {
    wVar7 = uVar18;
  }
  return wVar7;
}

Assistant:

static inline word Abc_TtDeriveBiDecOne( word * pTruth, int nVars, int This )
{
    word pTemp[64]; 
    int nThis = Abc_TtBitCount16(This);
    int v, nWords = Abc_TtWordNum(nVars);
    Abc_TtCopy( pTemp, pTruth, nWords, 0 );
    for ( v = 0; v < nVars; v++ )
        if ( !((This >> v) & 1) )
            Abc_TtExist( pTemp, v, nWords );
    Abc_TtShrink( pTemp, nThis, nVars, This );
    return Abc_Tt6Stretch( pTemp[0], nThis );
}